

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.cpp
# Opt level: O0

void __thiscall
BlockFilter::BlockFilter
          (BlockFilter *this,BlockFilterType filter_type,CBlock *block,CBlockUndo *block_undo)

{
  bool bVar1;
  invalid_argument *this_00;
  ElementSet *in_RCX;
  Params *in_RDX;
  undefined1 in_SIL;
  CBlockHeader *in_RDI;
  long in_FS_OFFSET;
  Params params;
  GCSFilter *in_stack_fffffffffffffec8;
  uint64_t in_stack_fffffffffffffed0;
  GCSFilter *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  Params *params_00;
  GCSFilter *this_01;
  undefined7 in_stack_ffffffffffffff30;
  CBlockUndo *in_stack_ffffffffffffff98;
  CBlock *in_stack_ffffffffffffffa0;
  Params local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 *)&in_RDI->nVersion = in_SIL;
  CBlockHeader::GetHash(in_RDI);
  this_01 = (GCSFilter *)0x0;
  params_00 = &local_20;
  GCSFilter::Params::Params
            (&in_stack_fffffffffffffed8->m_params,in_stack_fffffffffffffed0,
             (uint64_t)in_stack_fffffffffffffec8,'\0',0x8c1fba);
  GCSFilter::GCSFilter(this_01,params_00);
  GCSFilter::Params::Params
            (&in_stack_fffffffffffffed8->m_params,in_stack_fffffffffffffed0,
             (uint64_t)in_stack_fffffffffffffec8,'\0',0x8c1fe7);
  bVar1 = BuildParams((BlockFilter *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                      &in_stack_fffffffffffffed8->m_params);
  if (bVar1) {
    BasicFilterElements(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    GCSFilter::GCSFilter((GCSFilter *)CONCAT17(in_SIL,in_stack_ffffffffffffff30),in_RDX,in_RCX);
    GCSFilter::operator=(in_stack_fffffffffffffed8,(GCSFilter *)&stack0xffffffffffffff88);
    GCSFilter::~GCSFilter(in_stack_fffffffffffffec8);
    std::
    unordered_set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ByteVectorHash,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~unordered_set((unordered_set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ByteVectorHash,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)in_stack_fffffffffffffec8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
  }
  else {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"unknown filter_type");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  __stack_chk_fail();
}

Assistant:

BlockFilter::BlockFilter(BlockFilterType filter_type, const CBlock& block, const CBlockUndo& block_undo)
    : m_filter_type(filter_type), m_block_hash(block.GetHash())
{
    GCSFilter::Params params;
    if (!BuildParams(params)) {
        throw std::invalid_argument("unknown filter_type");
    }
    m_filter = GCSFilter(params, BasicFilterElements(block, block_undo));
}